

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxPortFactory.cpp
# Opt level: O0

Ptr __thiscall LinuxPortFactory::create(LinuxPortFactory *this,string *name)

{
  long lVar1;
  char *in_RDX;
  undefined1 local_21;
  bool isUsb;
  string *name_local;
  LinuxPortFactory *this_local;
  
  local_21 = 0;
  lVar1 = std::__cxx11::string::find(in_RDX,0x11f9b3);
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find(in_RDX,0x11f9ba);
    if (lVar1 == -1) goto LAB_0011c7a3;
  }
  local_21 = 1;
LAB_0011c7a3:
  (**(code **)(*(long *)name + 0x38))(this,name,in_RDX,local_21);
  return (__uniq_ptr_data<SerialPort,_std::default_delete<SerialPort>,_true,_true>)
         (__uniq_ptr_data<SerialPort,_std::default_delete<SerialPort>,_true,_true>)this;
}

Assistant:

SerialPort::Ptr
LinuxPortFactory::create(const std::string& name)
{
    bool isUsb = false;

    if (name.find("ttyUSB") != std::string::npos ||
        name.find("ttyACM") != std::string::npos)
        isUsb = true;

    return create(name, isUsb);
}